

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocParseString(TidyDocImpl *doc,ctmbstr content)

{
  uint uVar1;
  StreamIn *in_00;
  StreamIn *in;
  TidyBuffer inbuf;
  int status;
  ctmbstr content_local;
  TidyDocImpl *doc_local;
  
  inbuf._28_4_ = 0xffffffea;
  if (content != (ctmbstr)0x0) {
    tidyBufInitWithAllocator((TidyBuffer *)&in,doc->allocator);
    uVar1 = prvTidytmbstrlen(content);
    tidyBufAttach((TidyBuffer *)&in,(byte *)content,uVar1 + 1);
    in_00 = prvTidyBufferInput(doc,(TidyBuffer *)&in,(int)(doc->config).value[0x22].v);
    inbuf._28_4_ = prvTidyDocParseStream(doc,in_00);
    tidyBufDetach((TidyBuffer *)&in);
    prvTidyfreeStreamIn(in_00);
  }
  return inbuf._28_4_;
}

Assistant:

int   tidyDocParseString( TidyDocImpl* doc, ctmbstr content )
{
    int status = -EINVAL;
    TidyBuffer inbuf;
    StreamIn* in = NULL;

    if ( content )
    {
        tidyBufInitWithAllocator( &inbuf, doc->allocator );
        tidyBufAttach( &inbuf, (byte*)content, TY_(tmbstrlen)(content)+1 );
        in = TY_(BufferInput)( doc, &inbuf, cfg( doc, TidyInCharEncoding ));
        status = TY_(DocParseStream)( doc, in );
        tidyBufDetach( &inbuf );
        TY_(freeStreamIn)(in);
    }
    return status;
}